

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O0

void __thiscall Jupiter::GenericCommand::~GenericCommand(GenericCommand *this)

{
  bool bVar1;
  reference ppPVar2;
  Plugin **plugin;
  iterator __end1;
  iterator __begin1;
  vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_> *__range1;
  GenericCommand *this_local;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_001ea190;
  if (this->m_parent != (GenericCommandNamespace *)0x0) {
    GenericCommandNamespace::removeCommand(this->m_parent,this);
  }
  __end1 = std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::begin(&g_plugins);
  plugin = (Plugin **)
           std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>::end(&g_plugins);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
                      (&__end1,(__normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
                                *)&plugin);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
              ::operator*(&__end1);
    (*((*ppPVar2)->super_Thinker)._vptr_Thinker[0x1b])(*ppPVar2,this);
    __gnu_cxx::
    __normal_iterator<Jupiter::Plugin_**,_std::vector<Jupiter::Plugin_*,_std::allocator<Jupiter::Plugin_*>_>_>
    ::operator++(&__end1);
  }
  std::enable_shared_from_this<Jupiter::GenericCommand>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<Jupiter::GenericCommand>);
  Command::~Command(&this->super_Command);
  return;
}

Assistant:

Jupiter::GenericCommand::~GenericCommand() {
	// Inform the parent
	if (GenericCommand::m_parent != nullptr) {
		GenericCommand::m_parent->removeCommand(*this);
	}

	// Notify plugins
	for (auto& plugin : Jupiter::plugins) {
		plugin->OnGenericCommandRemove(*this);
	}
}